

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_highbd_dist_wtd_convolve_2d_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int16_t *piVar4;
  CONV_BUF_TYPE *pCVar5;
  byte bVar6;
  uint16_t uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  uint16_t *puVar14;
  short *psVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  short *psVar24;
  short *psVar25;
  long lVar26;
  uint local_8b58;
  int16_t im_block [17792];
  
  uVar1 = filter_params_y->taps;
  iVar19 = (uVar1 >> 1) - 1;
  uVar2 = filter_params_x->taps;
  piVar4 = filter_params_x->filter_ptr;
  bVar11 = (byte)conv_params->round_0;
  uVar18 = 0;
  if (0 < w) {
    uVar18 = (ulong)(uint)w;
  }
  uVar16 = (h + (uint)uVar1) - 1;
  uVar9 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar9 = 0;
  }
  iVar22 = 1 - (uint)(uVar2 >> 1);
  lVar26 = (long)w;
  pCVar5 = conv_params->dst;
  iVar3 = conv_params->dst_stride;
  bVar6 = (byte)conv_params->round_1;
  for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    iVar21 = iVar22;
    for (uVar20 = 0; uVar20 != uVar18; uVar20 = uVar20 + 1) {
      iVar17 = 1 << ((char)bd + 6U & 0x1f);
      for (uVar23 = 0; uVar2 != uVar23; uVar23 = uVar23 + 1) {
        iVar17 = iVar17 + (uint)src[((long)iVar21 + uVar23) - (long)(iVar19 * src_stride)] *
                          (int)*(short *)((long)piVar4 +
                                         uVar23 * 2 +
                                         (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2 * 2));
      }
      im_block[uVar20 + uVar8 * lVar26] =
           (int16_t)(iVar17 + ((1 << (bVar11 & 0x1f)) >> 1) >> (bVar11 & 0x1f));
      iVar21 = iVar21 + 1;
    }
    iVar22 = iVar22 + src_stride;
  }
  bVar10 = 0xe - (bVar6 + bVar11);
  bVar11 = ((char)bd - bVar11) + 0xe;
  local_8b58 = (uint)uVar1;
  piVar4 = filter_params_y->filter_ptr;
  bVar12 = bVar11 - bVar6;
  uVar8 = 0;
  uVar9 = (ulong)(uint)h;
  if (h < 1) {
    uVar9 = uVar8;
  }
  psVar24 = im_block + (1 - (ulong)(uVar1 >> 1)) * lVar26 + (long)(iVar19 * w);
  for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    psVar25 = psVar24;
    for (uVar20 = 0; uVar20 != uVar18; uVar20 = uVar20 + 1) {
      psVar15 = psVar25;
      iVar19 = 1 << (bVar11 & 0x1f);
      for (uVar23 = 0; filter_params_y->taps != uVar23; uVar23 = uVar23 + 1) {
        iVar19 = iVar19 + (int)*psVar15 *
                          (int)*(short *)((long)piVar4 +
                                         uVar23 * 2 + (ulong)((subpel_y_qn & 0xfU) * local_8b58 * 2)
                                         );
        psVar15 = psVar15 + lVar26;
      }
      uVar16 = iVar19 + ((1 << (bVar6 & 0x1f)) >> 1) >> (bVar6 & 0x1f);
      uVar7 = (uint16_t)uVar16;
      puVar14 = pCVar5 + uVar8 * (long)iVar3;
      if (conv_params->do_average != 0) {
        uVar13 = (uint)(pCVar5 + uVar8 * (long)iVar3)[uVar20];
        if (conv_params->use_dist_wtd_comp_avg == 0) {
          uVar16 = (uVar16 & 0xffff) + uVar13 >> 1;
        }
        else {
          uVar16 = (int)((uVar16 & 0xffff) * conv_params->bck_offset +
                        uVar13 * conv_params->fwd_offset) >> 4;
        }
        uVar7 = clip_pixel_highbd((int)(uVar16 + ((1 << (bVar10 & 0x1f)) >> 1) +
                                                 (-1 << (bVar12 & 0x1f)) +
                                                 (-1 << (bVar12 - 1 & 0x1f))) >> (bVar10 & 0x1f),bd)
        ;
        puVar14 = dst + uVar8 * (long)dst_stride;
      }
      puVar14[uVar20] = uVar7;
      psVar25 = psVar25 + 1;
    }
    psVar24 = psVar24 + lVar26;
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_c(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  int x, y, k;
  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = w;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  assert(round_bits >= 0);

  // horizontal filter
  const uint16_t *src_horiz = src - fo_vert * src_stride;
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (y = 0; y < im_h; ++y) {
    for (x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_horiz[y * src_stride + x - fo_horiz + k];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      (void)bd;
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (y = 0; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      int32_t sum = 1 << offset_bits;
      for (k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_vert[(y - fo_vert + k) * im_stride + x];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= (1 << (offset_bits - conv_params->round_1)) +
               (1 << (offset_bits - conv_params->round_1 - 1));
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, round_bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}